

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

ParsedSchemaList * __thiscall
capnp::ParsedSchema::getAllNested(ParsedSchemaList *__return_storage_ptr__,ParsedSchema *this)

{
  RawBrandedSchema *pRVar1;
  SchemaParser *pSVar2;
  Reader local_68;
  PointerReader local_38;
  
  pRVar1 = (this->super_Schema).raw;
  pSVar2 = this->parser;
  Schema::getProto(&local_68,&this->super_Schema);
  local_38.pointer = local_68._reader.pointers + 1;
  if (local_68._reader.pointerCount < 2) {
    local_38.pointer = (WirePointer *)0x0;
  }
  if (local_68._reader.pointerCount < 2) {
    local_68._reader.segment._0_4_ = 0;
    local_68._reader.segment._4_4_ = 0;
    local_68._reader.capTable._0_4_ = 0;
    local_68._reader.capTable._4_4_ = 0;
    local_68._reader.nestingLimit = 0x7fffffff;
  }
  local_38.segment._0_4_ = local_68._reader.segment._0_4_;
  local_38.segment._4_4_ = local_68._reader.segment._4_4_;
  local_38.capTable._0_4_ = local_68._reader.capTable._0_4_;
  local_38.capTable._4_4_ = local_68._reader.capTable._4_4_;
  local_38.nestingLimit = local_68._reader.nestingLimit;
  capnp::_::PointerReader::getList
            (&(__return_storage_ptr__->list).reader,&local_38,INLINE_COMPOSITE,(word *)0x0);
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  (__return_storage_ptr__->parent).parser = pSVar2;
  return __return_storage_ptr__;
}

Assistant:

ParsedSchema::ParsedSchemaList ParsedSchema::getAllNested() const {
  return ParsedSchemaList(*this, getProto().getNestedNodes());
}